

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

void isofile_free(isofile *file)

{
  void *pvVar1;
  void *in_RDI;
  content_conflict *tmp;
  content_conflict *con;
  undefined8 local_10;
  
  local_10 = *(void **)((long)in_RDI + 0xa8);
  while (local_10 != (void *)0x0) {
    pvVar1 = *(void **)((long)local_10 + 0x18);
    free(local_10);
    local_10 = pvVar1;
  }
  archive_entry_free((archive_entry *)0x17e4b2);
  archive_string_free((archive_string *)0x17e4c0);
  archive_string_free((archive_string *)0x17e4ce);
  archive_string_free((archive_string *)0x17e4dc);
  archive_string_free((archive_string *)0x17e4ea);
  free(in_RDI);
  return;
}

Assistant:

static void
isofile_free(struct isofile *file)
{
	struct content *con, *tmp;

	con = file->content.next;
	while (con != NULL) {
		tmp = con;
		con = con->next;
		free(tmp);
	}
	archive_entry_free(file->entry);
	archive_string_free(&(file->parentdir));
	archive_string_free(&(file->basename));
	archive_string_free(&(file->basename_utf16));
	archive_string_free(&(file->symlink));
	free(file);
}